

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chain)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  uVar1 = edges->m_count;
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray(&local_48,(ulong)uVar1);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_50 = ON_SubD::EdgeFromComponentIndex(subd,edges->m_a[uVar2]);
    ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
  }
  uVar1 = OrientEdgesIntoEdgeChains(&local_48,edge_chain);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chain
)
{
  const unsigned count = edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(subd.EdgeFromComponentIndex(edges[i]));
  return ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(a, edge_chain);
}